

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

void __thiscall
chrono::ChFrameMoving<double>::TransformLocalToParent
          (ChFrameMoving<double> *this,ChFrameMoving<double> *local,ChFrameMoving<double> *parent)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double local_50;
  double local_48;
  double local_40;
  ChCoordsys<double> *local_38;
  
  ChFrame<double>::TransformLocalToParent
            (&this->super_ChFrame<double>,&local->super_ChFrame<double>,
             &parent->super_ChFrame<double>);
  local_38 = &(local->super_ChFrame<double>).coord;
  PointSpeedLocalToParent(this,&local_38->pos,&(local->coord_dt).pos);
  if ((ChCoordsys<double> *)&local_50 != &parent->coord_dt) {
    (parent->coord_dt).pos.m_data[0] = local_50;
    (parent->coord_dt).pos.m_data[1] = local_48;
    (parent->coord_dt).pos.m_data[2] = local_40;
  }
  PointAccelerationLocalToParent
            (this,&local_38->pos,&(local->coord_dt).pos,&(local->coord_dtdt).pos);
  if ((ChCoordsys<double> *)&local_50 != &parent->coord_dtdt) {
    (parent->coord_dtdt).pos.m_data[0] = local_50;
    (parent->coord_dtdt).pos.m_data[1] = local_48;
    (parent->coord_dtdt).pos.m_data[2] = local_40;
  }
  dVar2 = (this->coord_dt).rot.m_data[1];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[2];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (this->coord_dt).rot.m_data[2];
  dVar3 = (local->super_ChFrame<double>).coord.rot.m_data[0];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar3;
  dVar4 = (local->super_ChFrame<double>).coord.rot.m_data[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar4;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = (this->coord_dt).rot.m_data[0];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[3];
  dVar5 = (this->coord_dt).rot.m_data[3];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar5;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar3 * dVar5;
  auVar16 = vfmadd231sd_fma(auVar15,auVar30,auVar32);
  auVar16 = vfnmadd231sd_fma(auVar16,auVar24,auVar28);
  auVar16 = vfmadd231sd_fma(auVar16,auVar18,auVar21);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[0];
  dVar3 = (this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar3;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = (local->coord_dt).rot.m_data[2];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[2];
  dVar5 = (local->coord_dt).rot.m_data[1];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar5;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = (local->coord_dt).rot.m_data[3];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = (local->coord_dt).rot.m_data[0];
  dVar6 = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar6;
  auVar14 = vmulsd_avx512f(auVar49,auVar17);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar37,auVar47);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar43,auVar45);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar39,auVar41);
  auVar15 = vaddsd_avx512f(auVar16,auVar14);
  auVar16 = vmulsd_avx512f(auVar24,auVar26);
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar30,auVar21);
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar34,auVar28);
  auVar16 = vfnmadd231sd_avx512f(auVar16,auVar18,auVar32);
  auVar14 = vmulsd_avx512f(auVar43,auVar49);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar37,auVar41);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar17,auVar45);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar39,auVar47);
  auVar17 = vaddsd_avx512f(auVar16,auVar14);
  auVar16 = vmulsd_avx512f(auVar18,auVar26);
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar30,auVar28);
  auVar16 = vfnmadd231sd_avx512f(auVar16,auVar34,auVar21);
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar24,auVar32);
  auVar14 = vmulsd_avx512f(auVar39,auVar49);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar37,auVar45);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar6;
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar51,auVar41);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar43,auVar47);
  auVar18 = vaddsd_avx512f(auVar16,auVar14);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar4 * dVar2;
  auVar16 = vfmsub231sd_fma(auVar16,auVar30,auVar26);
  auVar16 = vfnmadd231sd_fma(auVar16,auVar24,auVar21);
  auVar14 = vfnmadd231sd_fma(auVar16,auVar34,auVar32);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar5 * dVar3;
  auVar16 = vfmsub231sd_fma(auVar22,auVar37,auVar49);
  auVar16 = vfnmadd231sd_fma(auVar16,auVar43,auVar41);
  auVar16 = vfnmadd231sd_avx512f(auVar16,auVar51,auVar47);
  (parent->coord_dt).rot.m_data[0] = auVar14._0_8_ + auVar16._0_8_;
  pdVar1 = (parent->coord_dt).rot.m_data + 1;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  pdVar1 = (parent->coord_dt).rot.m_data + 2;
  vmovsd_avx512f(auVar17);
  *pdVar1 = *pdVar1;
  (parent->coord_dt).rot.m_data[3] = auVar15._0_8_;
  dVar2 = (this->coord_dtdt).rot.m_data[1];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (this->coord_dtdt).rot.m_data[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[0];
  dVar3 = (local->super_ChFrame<double>).coord.rot.m_data[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar3;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (this->coord_dtdt).rot.m_data[0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[3];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (this->coord_dtdt).rot.m_data[3];
  auVar16 = vmulsd_avx512f(auVar29,auVar31);
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar33,auVar27);
  auVar16 = vfnmadd231sd_avx512f(auVar16,auVar23,auVar35);
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar25,auVar19);
  dVar4 = (this->coord_dt).rot.m_data[1];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar4;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = (local->coord_dt).rot.m_data[2];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = (this->coord_dt).rot.m_data[2];
  dVar5 = (local->coord_dt).rot.m_data[1];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar5;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = (this->coord_dt).rot.m_data[0];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = (local->coord_dt).rot.m_data[3];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = (local->coord_dt).rot.m_data[0];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (this->coord_dt).rot.m_data[3];
  auVar14 = vmulsd_avx512f(auVar50,auVar44);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar46,auVar40);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar38,auVar48);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar42,auVar36);
  auVar14 = vaddsd_avx512f(auVar14,auVar14);
  auVar16 = vaddsd_avx512f(auVar16,auVar14);
  dVar6 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  dVar7 = (this->super_ChFrame<double>).coord.rot.m_data[1];
  dVar8 = (local->coord_dtdt).rot.m_data[2];
  dVar9 = (this->super_ChFrame<double>).coord.rot.m_data[2];
  dVar10 = (local->coord_dtdt).rot.m_data[1];
  dVar11 = (local->coord_dtdt).rot.m_data[3];
  dVar12 = (local->coord_dtdt).rot.m_data[0];
  dVar13 = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar13;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar12;
  auVar14 = vmulsd_avx512f(auVar66,auVar62);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar6;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar11;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar52,auVar58);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar9;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar10;
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar56,auVar64);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar8;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar7;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar60,auVar54);
  auVar15 = vaddsd_avx512f(auVar16,auVar14);
  auVar16 = vmulsd_avx512f(auVar23,auVar29);
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar33,auVar19);
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar31,auVar35);
  auVar16 = vfnmadd231sd_avx512f(auVar16,auVar25,auVar27);
  auVar14 = vmulsd_avx512f(auVar38,auVar50);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar46,auVar36);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar44,auVar48);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar42,auVar40);
  auVar14 = vaddsd_avx512f(auVar14,auVar14);
  auVar16 = vaddsd_avx512f(auVar16,auVar14);
  auVar14 = vmulsd_avx512f(auVar56,auVar66);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar52,auVar54);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar62,auVar64);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar60,auVar58);
  auVar17 = vaddsd_avx512f(auVar16,auVar14);
  auVar16 = vmulsd_avx512f(auVar25,auVar29);
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar33,auVar35);
  auVar16 = vfnmadd231sd_avx512f(auVar16,auVar31,auVar19);
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar23,auVar27);
  auVar14 = vmulsd_avx512f(auVar42,auVar50);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar46,auVar48);
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar44,auVar36);
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar38,auVar40);
  auVar14 = vaddsd_avx512f(auVar14,auVar14);
  auVar16 = vaddsd_avx512f(auVar16,auVar14);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar7;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar12;
  auVar14 = vmulsd_avx512f(auVar61,auVar67);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar6;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar10;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar53,auVar65);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar8;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar13;
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar63,auVar55);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar9;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar11;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar57,auVar59);
  auVar18 = vaddsd_avx512f(auVar16,auVar14);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3 * dVar2;
  auVar16 = vfmsub231sd_fma(auVar14,auVar33,auVar29);
  auVar16 = vfnmadd231sd_fma(auVar16,auVar23,auVar19);
  auVar14 = vfnmadd231sd_fma(auVar16,auVar31,auVar27);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar5 * dVar4;
  auVar16 = vfmsub231sd_fma(auVar20,auVar46,auVar50);
  auVar16 = vfnmadd231sd_fma(auVar16,auVar38,auVar36);
  auVar16 = vfnmadd231sd_fma(auVar16,auVar44,auVar40);
  auVar19 = vmulsd_avx512f(auVar65,auVar61);
  auVar19 = vfmsub231sd_avx512f(auVar19,auVar53,auVar67);
  auVar19 = vfnmadd231sd_avx512f(auVar19,auVar57,auVar55);
  auVar19 = vfnmadd231sd_avx512f(auVar19,auVar63,auVar59);
  (parent->coord_dtdt).rot.m_data[0] = auVar14._0_8_ + auVar16._0_8_ + auVar16._0_8_ + auVar19._0_8_
  ;
  pdVar1 = (parent->coord_dtdt).rot.m_data + 1;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  pdVar1 = (parent->coord_dtdt).rot.m_data + 2;
  vmovsd_avx512f(auVar17);
  *pdVar1 = *pdVar1;
  pdVar1 = (parent->coord_dtdt).rot.m_data + 3;
  vmovsd_avx512f(auVar15);
  *pdVar1 = *pdVar1;
  return;
}

Assistant:

void TransformLocalToParent(
        const ChFrameMoving<Real>& local,  ///< frame to transform, given in local frame coordinates
        ChFrameMoving<Real>& parent        ///< transformed frame, in parent coordinates, will be stored here
    ) const {
        // pos & rot
        ChFrame<Real>::TransformLocalToParent(local, parent);

        // pos_dt
        parent.coord_dt.pos = PointSpeedLocalToParent(local.coord.pos, local.coord_dt.pos);

        // pos_dtdt
        parent.coord_dtdt.pos =
            PointAccelerationLocalToParent(local.coord.pos, local.coord_dt.pos, local.coord_dtdt.pos);

        // rot_dt
        parent.coord_dt.rot = coord_dt.rot % local.coord.rot + this->coord.rot % local.coord_dt.rot;

        // rot_dtdt
        parent.coord_dtdt.rot = coord_dtdt.rot % local.coord.rot + (coord_dt.rot % local.coord_dt.rot) * 2 +
                                this->coord.rot % local.coord_dtdt.rot;
    }